

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::checkForNamedInterface(CoreBroker *this,ActionMessage *command)

{
  byte *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  uint16_t flags;
  GlobalHandle target;
  GlobalHandle target_00;
  GlobalHandle target_01;
  GlobalHandle target_02;
  GlobalHandle fed_id;
  GlobalHandle target_03;
  GlobalHandle target_04;
  GlobalHandle fed_id_00;
  GlobalHandle target_05;
  GlobalHandle GVar22;
  GlobalHandle fed_id_01;
  GlobalHandle fed_id_02;
  size_type sVar23;
  size_type sVar24;
  byte *pbVar25;
  undefined1 auVar26 [16];
  string_view type;
  string_view message;
  string_view units;
  ushort uVar27;
  BasicHandleInfo *pBVar28;
  iterator iVar29;
  string *psVar30;
  iterator iVar31;
  pointer pBVar32;
  BasicHandleInfo *pBVar33;
  InterfaceType what;
  action_t aVar34;
  InterfaceHandle IVar35;
  GlobalFederateId fed_id_03;
  char *pcVar36;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view string1;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view string1_00;
  string_view string1_01;
  string_view string1_02;
  string_view string2;
  string_view name_03;
  string_view string2_00;
  string_view string2_01;
  string_view string2_02;
  string_view str;
  size_t sVar37;
  char *pcVar38;
  size_t sVar39;
  char *pcVar40;
  key_type local_84;
  undefined8 local_80;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_58;
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char *pcStack_38;
  
  flags = command->flags;
  if ((-1 < (char)flags) || ((this->super_BrokerBase).field_0x294 != '\x01')) goto LAB_0032dfec;
  aVar34 = command->messageAction;
  switch(aVar34) {
  case cmd_add_named_input:
    target.fed_id.gid = (command->source_id).gid;
    target.handle.hid = (command->source_handle).hid;
    key._M_str = (char *)(command->payload).heap;
    key._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addReconnectableInput(&this->unknownHandles,key,target,flags);
    break;
  case cmd_add_named_filter:
    target_01.fed_id.gid = (command->source_id).gid;
    target_01.handle.hid = (command->source_handle).hid;
    key_02._M_str = (char *)(command->payload).heap;
    key_02._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addReconnectableFilter(&this->unknownHandles,key_02,target_01,flags);
    break;
  case cmd_add_named_publication:
    target_00.fed_id.gid = (command->source_id).gid;
    target_00.handle.hid = (command->source_handle).hid;
    key_00._M_str = (char *)(command->payload).heap;
    key_00._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addReconnectablePublication(&this->unknownHandles,key_00,target_00,flags);
    break;
  case cmd_add_named_endpoint:
    GVar22.fed_id.gid = (command->source_id).gid;
    GVar22.handle.hid = (command->source_handle).hid;
    key_01._M_str = (char *)(command->payload).heap;
    key_01._M_len = (command->payload).bufferSize;
    UnknownHandleManager::addReconnectableEndpoint(&this->unknownHandles,key_01,GVar22,flags);
    break;
  default:
    goto switchD_0032df5c_default;
  }
LAB_0032dfec:
  aVar34 = command->messageAction;
switchD_0032df5c_default:
  switch(aVar34) {
  case cmd_add_named_input:
    name._M_str = (char *)(command->payload).heap;
    name._M_len = (command->payload).bufferSize;
    pBVar28 = HandleManager::getInterfaceHandle(&this->handles,name,INPUT);
    if (pBVar28 != (BasicHandleInfo *)0x0) {
      local_84.gid = (pBVar28->handle).fed_id.gid;
      iVar29 = std::
               _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&(this->mFederates).lookup2,&local_84);
      if (iVar29.
          super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
          ._M_cur == (__node_type *)0x0) {
        pBVar32 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar32 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                  *(long *)((long)iVar29.
                                  super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
                                  ._M_cur + 0x10);
      }
      if (pBVar32->state < ERROR_STATE) {
        ActionMessage::setAction(command,cmd_add_publisher);
        IVar35.hid = (pBVar28->handle).handle.hid;
        command->dest_id = (GlobalFederateId)(pBVar28->handle).fed_id.gid;
        command->dest_handle = (InterfaceHandle)IVar35.hid;
        fed_id_01.fed_id.gid = (command->source_id).gid;
        fed_id_01.handle.hid = (command->source_handle).hid;
        pBVar33 = HandleManager::findHandle(&this->handles,fed_id_01);
        if (pBVar33 != (BasicHandleInfo *)0x0) {
          string1_00._M_str = (pBVar33->type)._M_dataplus._M_p;
          string1_00._M_len = (pBVar33->type)._M_string_length;
          string2_00._M_str = (pBVar33->units)._M_dataplus._M_p;
          string2_00._M_len = (pBVar33->units)._M_string_length;
          ActionMessage::setStringData(command,string1_00,string2_00);
        }
        (command->payload).bufferSize = 0;
        routeMessage(this,command);
        ActionMessage::setAction(command,cmd_add_subscriber);
        uVar4 = command->source_id;
        uVar9 = command->source_handle;
        uVar14 = command->dest_id;
        uVar19 = command->dest_handle;
        command->source_id = (GlobalFederateId)uVar14;
        command->source_handle = (InterfaceHandle)uVar19;
        command->dest_id = (GlobalFederateId)uVar4;
        command->dest_handle = (InterfaceHandle)uVar9;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&command->stringData,
                          (command->stringData).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        pbVar25 = (byte *)(pBVar28->key)._M_dataplus._M_p;
        sVar39 = (pBVar28->key)._M_string_length;
        if ((command->payload).heap == pbVar25) {
          (command->payload).bufferSize = sVar39;
        }
        else {
          SmallBuffer::reserve(&command->payload,sVar39);
          (command->payload).bufferSize = sVar39;
          if (sVar39 != 0) {
            memcpy((command->payload).heap,pbVar25,sVar39);
          }
        }
        goto LAB_0032e79d;
      }
      aVar34 = cmd_add_subscriber;
LAB_0032e64c:
      ActionMessage::setAction(command,aVar34);
      *(byte *)&command->flags = (byte)command->flags | 0x10;
      uVar5 = command->source_id;
      uVar10 = command->source_handle;
      uVar15 = command->dest_id;
      uVar20 = command->dest_handle;
      command->source_id = (GlobalFederateId)uVar15;
      command->source_handle = (InterfaceHandle)uVar20;
      command->dest_id = (GlobalFederateId)uVar5;
      command->dest_handle = (InterfaceHandle)uVar10;
      IVar35.hid = (pBVar28->handle).handle.hid;
      command->source_id = (GlobalFederateId)(pBVar28->handle).fed_id.gid;
      command->source_handle = (InterfaceHandle)IVar35.hid;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&command->stringData,
                        (command->stringData).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
LAB_0032e79d:
      routeMessage(this,command);
      return;
    }
    break;
  case cmd_add_named_filter:
    name_02._M_str = (char *)(command->payload).heap;
    name_02._M_len = (command->payload).bufferSize;
    pBVar28 = HandleManager::getInterfaceHandle(&this->handles,name_02,FILTER);
    if (pBVar28 != (BasicHandleInfo *)0x0) {
      ActionMessage::setAction(command,cmd_add_endpoint);
      GVar22 = pBVar28->handle;
      (command->dest_id).gid = GVar22.fed_id.gid.gid;
      (command->dest_handle).hid = GVar22.handle.hid.hid;
      (command->payload).bufferSize = 0;
      routeMessage(this,command);
      ActionMessage::setAction(command,cmd_add_filter);
      uVar2 = command->source_id;
      uVar7 = command->source_handle;
      uVar12 = command->dest_id;
      uVar17 = command->dest_handle;
      command->source_id = (GlobalFederateId)uVar12;
      command->source_handle = (InterfaceHandle)uVar17;
      command->dest_id = (GlobalFederateId)uVar2;
      command->dest_handle = (InterfaceHandle)uVar7;
      sVar23 = pBVar28->type_in->_M_string_length;
      sVar24 = pBVar28->type_out->_M_string_length;
      if (sVar23 != 0 || sVar24 != 0) {
        string1._M_str = (pBVar28->type_in->_M_dataplus)._M_p;
        string1._M_len = sVar23;
        string2._M_str = (pBVar28->type_out->_M_dataplus)._M_p;
        string2._M_len = sVar24;
        ActionMessage::setStringData(command,string1,string2);
      }
      if ((pBVar28->flags & 0x200) != 0) {
        pbVar1 = (byte *)((long)&command->flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      goto LAB_0032e2be;
    }
    break;
  case cmd_add_named_publication:
    name_00._M_str = (char *)(command->payload).heap;
    name_00._M_len = (command->payload).bufferSize;
    pBVar28 = HandleManager::getInterfaceHandle(&this->handles,name_00,PUBLICATION);
    if (pBVar28 != (BasicHandleInfo *)0x0) {
      local_84.gid = (pBVar28->handle).fed_id.gid;
      iVar29 = std::
               _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&(this->mFederates).lookup2,&local_84);
      if (iVar29.
          super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
          ._M_cur == (__node_type *)0x0) {
        pBVar32 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar32 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                  *(long *)((long)iVar29.
                                  super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
                                  ._M_cur + 0x10);
      }
      if (pBVar32->state < ERROR_STATE) {
        ActionMessage::setAction(command,cmd_add_subscriber);
        GVar22 = pBVar28->handle;
        (command->dest_id).gid = GVar22.fed_id.gid.gid;
        (command->dest_handle).hid = GVar22.handle.hid.hid;
        (command->payload).bufferSize = 0;
        routeMessage(this,command);
        ActionMessage::setAction(command,cmd_add_publisher);
        uVar3 = command->source_id;
        uVar8 = command->source_handle;
        uVar13 = command->dest_id;
        uVar18 = command->dest_handle;
        command->source_id = (GlobalFederateId)uVar13;
        command->source_handle = (InterfaceHandle)uVar18;
        command->dest_id = (GlobalFederateId)uVar3;
        command->dest_handle = (InterfaceHandle)uVar8;
        pbVar25 = (byte *)(pBVar28->key)._M_dataplus._M_p;
        sVar39 = (pBVar28->key)._M_string_length;
        if ((command->payload).heap == pbVar25) {
          (command->payload).bufferSize = sVar39;
        }
        else {
          SmallBuffer::reserve(&command->payload,sVar39);
          (command->payload).bufferSize = sVar39;
          if (sVar39 != 0) {
            memcpy((command->payload).heap,pbVar25,sVar39);
          }
        }
        string1_02._M_str = (pBVar28->type)._M_dataplus._M_p;
        string1_02._M_len = (pBVar28->type)._M_string_length;
        string2_02._M_str = (pBVar28->units)._M_dataplus._M_p;
        string2_02._M_len = (pBVar28->units)._M_string_length;
        ActionMessage::setStringData(command,string1_02,string2_02);
        goto LAB_0032e79d;
      }
      aVar34 = cmd_add_publisher;
      goto LAB_0032e64c;
    }
    break;
  case cmd_add_named_endpoint:
    name_01._M_str = (char *)(command->payload).heap;
    name_01._M_len = (command->payload).bufferSize;
    pBVar28 = HandleManager::getInterfaceHandle(&this->handles,name_01,ENDPOINT);
    if (pBVar28 != (BasicHandleInfo *)0x0) {
      local_84.gid = (pBVar28->handle).fed_id.gid;
      iVar29 = std::
               _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&(this->mFederates).lookup2,&local_84);
      if (iVar29.
          super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
          ._M_cur == (__node_type *)0x0) {
        pBVar32 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar32 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                  *(long *)((long)iVar29.
                                  super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
                                  ._M_cur + 0x10);
      }
      if (0x27 < pBVar32->state) {
        aVar34 = cmd_add_endpoint;
        goto LAB_0032e64c;
      }
      if (command->counter == 0x65) {
        ActionMessage::setAction(command,cmd_add_endpoint);
        uVar27 = command->flags ^ 2;
LAB_0032e6dc:
        command->flags = uVar27;
      }
      else {
        ActionMessage::setAction(command,cmd_add_filter);
        fed_id_02.fed_id.gid = (command->source_id).gid;
        fed_id_02.handle.hid = (command->source_handle).hid;
        pBVar33 = HandleManager::findHandle(&this->handles,fed_id_02);
        if (pBVar33 != (BasicHandleInfo *)0x0) {
          sVar23 = pBVar33->type_in->_M_string_length;
          sVar24 = pBVar33->type_out->_M_string_length;
          if (sVar23 != 0 || sVar24 != 0) {
            string1_01._M_str = (pBVar33->type_in->_M_dataplus)._M_p;
            string1_01._M_len = sVar23;
            string2_01._M_str = (pBVar33->type_out->_M_dataplus)._M_p;
            string2_01._M_len = sVar24;
            ActionMessage::setStringData(command,string1_01,string2_01);
          }
          if ((pBVar33->flags & 0x200) != 0) {
            uVar27 = command->flags | 0x200;
            goto LAB_0032e6dc;
          }
        }
      }
      IVar35.hid = (pBVar28->handle).handle.hid;
      command->dest_id = (GlobalFederateId)(pBVar28->handle).fed_id.gid;
      command->dest_handle = (InterfaceHandle)IVar35.hid;
      routeMessage(this,command);
      ActionMessage::setAction(command,cmd_add_endpoint);
      if (command->counter == 0x65) {
        *(byte *)&command->flags = (byte)command->flags ^ 2;
        pbVar25 = (byte *)(pBVar28->key)._M_dataplus._M_p;
        sVar39 = (pBVar28->key)._M_string_length;
        if ((command->payload).heap == pbVar25) {
          (command->payload).bufferSize = sVar39;
        }
        else {
          SmallBuffer::reserve(&command->payload,sVar39);
          (command->payload).bufferSize = sVar39;
          if (sVar39 != 0) {
            memcpy((command->payload).heap,pbVar25,sVar39);
          }
        }
        str._M_str = (pBVar28->type)._M_dataplus._M_p;
        str._M_len = (pBVar28->type)._M_string_length;
        ActionMessage::setString(command,0,str);
      }
      uVar6 = command->source_id;
      uVar11 = command->source_handle;
      uVar16 = command->dest_id;
      uVar21 = command->dest_handle;
      command->source_id = (GlobalFederateId)uVar16;
      command->source_handle = (InterfaceHandle)uVar21;
      command->dest_id = (GlobalFederateId)uVar6;
      command->dest_handle = (InterfaceHandle)uVar11;
      goto LAB_0032e79d;
    }
  }
  if ((this->super_BrokerBase).field_0x294 == '\x01') {
    switch(command->messageAction) {
    case cmd_add_named_input:
      target_02.fed_id.gid = (command->source_id).gid;
      target_02.handle.hid = (command->source_handle).hid;
      key_03._M_str = (char *)(command->payload).heap;
      key_03._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addUnknownInput(&this->unknownHandles,key_03,target_02,command->flags);
      if ((command->stringData).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (command->stringData).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      fed_id.fed_id.gid = (command->source_id).gid;
      fed_id.handle.hid = (command->source_handle).hid;
      pBVar28 = HandleManager::findHandle(&this->handles,fed_id);
      if (pBVar28 != (BasicHandleInfo *)0x0) {
        return;
      }
      fed_id_03.gid = (command->source_id).gid;
      IVar35.hid = (command->source_handle).hid;
      psVar30 = ActionMessage::getString_abi_cxx11_(command,0);
      pcStack_38 = (psVar30->_M_dataplus)._M_p;
      local_40 = psVar30->_M_string_length;
      psVar30 = ActionMessage::getString_abi_cxx11_(command,1);
      pcVar40 = (psVar30->_M_dataplus)._M_p;
      sVar39 = psVar30->_M_string_length;
      what = PUBLICATION;
      pcVar36 = (char *)0x0;
      sVar37 = local_40;
      pcVar38 = pcStack_38;
      local_50 = sVar39;
      pcStack_48 = pcVar40;
      break;
    case cmd_add_named_filter:
      target_05.fed_id.gid = (command->source_id).gid;
      target_05.handle.hid = (command->source_handle).hid;
      key_06._M_str = (char *)(command->payload).heap;
      key_06._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addUnknownFilter(&this->unknownHandles,key_06,target_05,command->flags);
      return;
    case cmd_add_named_publication:
      target_03.fed_id.gid = (command->source_id).gid;
      target_03.handle.hid = (command->source_handle).hid;
      key_04._M_str = (char *)(command->payload).heap;
      key_04._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addUnknownPublication
                (&this->unknownHandles,key_04,target_03,command->flags);
      return;
    case cmd_add_named_endpoint:
      target_04.fed_id.gid = (command->source_id).gid;
      target_04.handle.hid = (command->source_handle).hid;
      key_05._M_str = (char *)(command->payload).heap;
      key_05._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addUnknownEndpoint
                (&this->unknownHandles,key_05,target_04,command->flags);
      if ((command->stringData).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (command->stringData).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      fed_id_00.fed_id.gid = (command->source_id).gid;
      fed_id_00.handle.hid = (command->source_handle).hid;
      pBVar28 = HandleManager::findHandle(&this->handles,fed_id_00);
      if (pBVar28 != (BasicHandleInfo *)0x0) {
        return;
      }
      fed_id_03.gid = (command->source_id).gid;
      IVar35.hid = (command->source_handle).hid;
      psVar30 = ActionMessage::getString_abi_cxx11_(command,0);
      pcStack_58 = (psVar30->_M_dataplus)._M_p;
      local_60 = psVar30->_M_string_length;
      psVar30 = ActionMessage::getString_abi_cxx11_(command,1);
      pcVar40 = (psVar30->_M_dataplus)._M_p;
      sVar39 = psVar30->_M_string_length;
      pcVar36 = "";
      what = FILTER;
      sVar37 = local_60;
      pcVar38 = pcStack_58;
      local_70 = sVar39;
      pcStack_68 = pcVar40;
      break;
    default:
      local_80 = 0x33;
      pcStack_78 = "unknown command in interface addition code section\n";
      message._M_str = "unknown command in interface addition code section\n";
      message._M_len = 0x33;
      name_03._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_03._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (&this->super_BrokerBase,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name_03,
                 message,false);
      return;
    }
    type._M_str = pcVar38;
    type._M_len = sVar37;
    units._M_str = pcVar40;
    units._M_len = sVar39;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = pcVar36;
    pBVar28 = HandleManager::addHandle
                        (&this->handles,fed_id_03,IVar35,what,(string_view)(auVar26 << 0x40),type,
                         units);
    iVar31 = CLI::std::
             _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->global_id_translation)._M_h,&command->source_id);
    if (iVar31.
        super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false>
        ._M_cur != (__node_type *)0x0) {
      (pBVar28->local_fed_id).fid =
           *(BaseType *)
            ((long)iVar31.
                   super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false>
                   ._M_cur + 0xc);
    }
    pBVar28->flags = command->flags;
    return;
  }
LAB_0032e2be:
  routeMessage(this,command);
  return;
}

Assistant:

void CoreBroker::checkForNamedInterface(ActionMessage& command)
{
    bool foundInterface = false;
    if (checkActionFlag(command, reconnectable_flag)) {
        if (isRootc) {
            switch (command.action()) {
                case CMD_ADD_NAMED_PUBLICATION:
                    unknownHandles.addReconnectablePublication(command.name(),
                                                               command.getSource(),
                                                               command.flags);
                    break;
                case CMD_ADD_NAMED_INPUT:
                    unknownHandles.addReconnectableInput(command.name(),
                                                         command.getSource(),
                                                         command.flags);

                    break;
                case CMD_ADD_NAMED_ENDPOINT:
                    unknownHandles.addReconnectableEndpoint(command.name(),
                                                            command.getSource(),
                                                            command.flags);

                    break;
                case CMD_ADD_NAMED_FILTER:
                    unknownHandles.addReconnectableFilter(command.name(),
                                                          command.getSource(),
                                                          command.flags);
                    break;
                default:
                    break;
            }
        }
    }
    switch (command.action()) {
        case CMD_ADD_NAMED_PUBLICATION: {
            auto* pub = handles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                auto fed = mFederates.find(pub->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    command.setDestination(pub->handle);
                    command.payload.clear();
                    routeMessage(command);
                    command.setAction(CMD_ADD_PUBLISHER);
                    command.swapSourceDest();
                    command.name(pub->key);
                    command.setStringData(pub->type, pub->units);
                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_PUBLISHER);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(pub->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_INPUT: {
            auto* inp = handles.getInterfaceHandle(command.name(), InterfaceType::INPUT);
            if (inp != nullptr) {
                auto fed = mFederates.find(inp->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    command.setAction(CMD_ADD_PUBLISHER);
                    command.setDestination(inp->handle);
                    auto* pub = handles.findHandle(command.getSource());
                    if (pub != nullptr) {
                        command.setStringData(pub->type, pub->units);
                    }
                    command.payload.clear();
                    routeMessage(command);
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    command.swapSourceDest();
                    command.clearStringData();
                    command.name(inp->key);
                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(inp->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_FILTER: {
            auto* filt = handles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                command.setAction(CMD_ADD_ENDPOINT);
                command.setDestination(filt->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_ADD_FILTER);
                command.swapSourceDest();
                if ((!filt->type_in.empty()) || (!filt->type_out.empty())) {
                    command.setStringData(filt->type_in, filt->type_out);
                }
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(command, clone_flag);
                }
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_ENDPOINT: {
            auto* ept = handles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                auto fed = mFederates.find(ept->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    if (command.counter == static_cast<uint16_t>(InterfaceType::ENDPOINT)) {
                        command.setAction(CMD_ADD_ENDPOINT);
                        toggleActionFlag(command, destination_target);
                    } else {
                        command.setAction(CMD_ADD_FILTER);
                        auto* filt = handles.findHandle(command.getSource());
                        if (filt != nullptr) {
                            if ((!filt->type_in.empty()) || (!filt->type_out.empty())) {
                                command.setStringData(filt->type_in, filt->type_out);
                            }
                            if (checkActionFlag(*filt, clone_flag)) {
                                setActionFlag(command, clone_flag);
                            }
                        }
                    }
                    command.setDestination(ept->handle);
                    routeMessage(command);
                    command.setAction(CMD_ADD_ENDPOINT);
                    if (command.counter == static_cast<uint16_t>(InterfaceType::ENDPOINT)) {
                        toggleActionFlag(command, destination_target);
                        command.name(ept->key);
                        command.setString(typeStringLoc, ept->type);
                    }
                    command.swapSourceDest();
                    // command.setSource(ept->handle);

                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_ENDPOINT);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(ept->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        default:
            break;
    }

    if (!foundInterface) {
        if (isRootc) {
            switch (command.action()) {
                case CMD_ADD_NAMED_PUBLICATION:
                    unknownHandles.addUnknownPublication(command.name(),
                                                         command.getSource(),
                                                         command.flags);
                    break;
                case CMD_ADD_NAMED_INPUT:
                    unknownHandles.addUnknownInput(command.name(),
                                                   command.getSource(),
                                                   command.flags);
                    if (!command.getStringData().empty()) {
                        auto* pub = handles.findHandle(command.getSource());
                        if (pub == nullptr) {
                            // an anonymous publisher is adding an input
                            auto& apub = handles.addHandle(command.source_id,
                                                           command.source_handle,
                                                           InterfaceType::PUBLICATION,
                                                           std::string_view(),
                                                           command.getString(typeStringLoc),
                                                           command.getString(unitStringLoc));

                            addLocalInfo(apub, command);
                        }
                    }
                    break;
                case CMD_ADD_NAMED_ENDPOINT:
                    unknownHandles.addUnknownEndpoint(command.name(),
                                                      command.getSource(),
                                                      command.flags);
                    if (!command.getStringData().empty()) {
                        auto* filt = handles.findHandle(command.getSource());
                        if (filt == nullptr) {
                            // an anonymous filter is adding an endpoint
                            auto& afilt = handles.addHandle(command.source_id,
                                                            command.source_handle,
                                                            InterfaceType::FILTER,
                                                            "",
                                                            command.getString(typeStringLoc),
                                                            command.getString(typeOutStringLoc));

                            addLocalInfo(afilt, command);
                        }
                    }
                    break;
                case CMD_ADD_NAMED_FILTER:
                    unknownHandles.addUnknownFilter(command.name(),
                                                    command.getSource(),
                                                    command.flags);
                    break;
                default:
                    LOG_WARNING(global_broker_id_local,
                                getIdentifier(),
                                "unknown command in interface addition code section\n");
                    break;
            }
        } else {
            routeMessage(command);
        }
    }
}